

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Result RVar3;
  wabt *this;
  char *out_data;
  string_view filename;
  string_view filename_00;
  ReadBinaryOptions options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  BinaryReaderStrip reader;
  Features features;
  undefined1 local_1d8 [16];
  undefined1 auStack_1c8 [16];
  undefined4 local_1b8;
  void *local_1a8;
  long lStack_1a0;
  long local_198;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  Errors local_168;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [48];
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_e0;
  Features local_a3;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_90;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_150,"wasm-strip",
             "  Remove sections of a WebAssembly binary file.\n\nexamples:\n  # Remove all custom sections from test.wasm\n  $ wasm-strip test.wasm\n"
            );
  auStack_1c8._3_5_ = 0x656d616e65;
  local_1d8._8_7_ = 8;
  stack0xfffffffffffffe37 = 0x6c696600;
  auStack_1c8._8_8_ = auStack_1c8._8_8_ & 0xffffffffffffff00;
  local_188._M_unused._M_object = (code **)0x0;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:45:22)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:45:22)>
              ::_M_manager;
  local_1d8._0_8_ = auStack_1c8;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_150,(string *)local_1d8,One,(Callback *)&local_188);
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,3);
  }
  if ((undefined1 *)local_1d8._0_8_ != auStack_1c8) {
    operator_delete((void *)local_1d8._0_8_,CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_) + 1);
  }
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_7_ = 0;
  auStack_1c8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:50:20)>
       ::_M_invoke;
  local_1d8[0xf] = '\0';
  auStack_1c8._0_3_ = 0x10de30;
  auStack_1c8._3_5_ = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_150,'o',"output","FILE","output wasm binary file",
             (Callback *)local_1d8);
  if ((code *)CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_))(local_1d8,local_1d8,3);
  }
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_7_ = 0;
  auStack_1c8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:53:20)>
       ::_M_invoke;
  local_1d8[0xf] = '\0';
  auStack_1c8._0_3_ = 0x10de74;
  auStack_1c8._3_5_ = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_150,'k',"keep-section","SECTION NAME",
             "Section name to keep in the final output",(Callback *)local_1d8);
  if ((code *)CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_))(local_1d8,local_1d8,3);
  }
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_7_ = 0;
  auStack_1c8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:58:20)>
       ::_M_invoke;
  local_1d8[0xf] = '\0';
  auStack_1c8._0_3_ = 0x10deb8;
  auStack_1c8._3_5_ = 0;
  out_data = "SECTION NAME";
  wabt::OptionParser::AddOption
            ((OptionParser *)local_150,'R',"remove-section","SECTION NAME",
             "Section to specifically remove, including all the rest",(Callback *)local_1d8);
  if ((code *)CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(auStack_1c8._3_5_,auStack_1c8._0_3_))(local_1d8,local_1d8,3);
  }
  wabt::OptionParser::Parse((OptionParser *)local_150,argc,argv);
  if ((_Link_type)local_e0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Link_type)0x0) {
    (*(code *)local_e0._M_impl.super__Rb_tree_header._M_header._M_parent)(&local_e0,&local_e0,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_110 + 0x18));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,(ulong)(local_120._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  _Var1._M_p = s_filename_abi_cxx11_._M_dataplus._M_p;
  local_1a8 = (void *)0x0;
  lStack_1a0 = 0;
  local_198 = 0;
  this = (wabt *)strlen(s_filename_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&local_1a8;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  RVar3.enum_ = Error;
  if (RVar2.enum_ != Error) {
    local_168.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a3.exceptions_enabled_ = false;
    local_a3.mutable_globals_enabled_ = true;
    local_a3.sat_float_to_int_enabled_ = true;
    local_a3.sign_extension_enabled_ = true;
    local_a3.simd_enabled_ = true;
    local_a3.threads_enabled_ = false;
    local_a3.function_references_enabled_ = false;
    local_a3.multi_value_enabled_ = true;
    local_a3.tail_call_enabled_ = false;
    local_a3.bulk_memory_enabled_ = true;
    local_a3.reference_types_enabled_ = true;
    local_a3.annotations_enabled_ = false;
    local_a3.code_metadata_enabled_ = false;
    local_a3.gc_enabled_ = false;
    local_a3.memory64_enabled_ = false;
    local_a3.multi_memory_enabled_ = false;
    local_a3.extended_const_enabled_ = false;
    local_a3.relaxed_simd_enabled_ = false;
    local_a3.custom_page_sizes_enabled_ = false;
    wabt::Features::EnableAll(&local_a3);
    local_1d8._0_8_ = CONCAT71(local_a3._1_7_,local_a3.exceptions_enabled_);
    local_1d8._8_7_ = CONCAT43(local_a3._11_4_,CONCAT21(local_a3._9_2_,local_a3.tail_call_enabled_))
    ;
    auStack_1c8._0_3_ = local_a3._16_3_;
    local_1d8[0xf] = local_a3.multi_memory_enabled_;
    auStack_1c8._8_8_ = (code *)0x0;
    local_1b8._0_1_ = false;
    local_1b8._1_1_ = true;
    local_1b8._2_1_ = false;
    local_1b8._3_1_ = false;
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_Rb_tree(&local_60,&v_sections_to_keep._M_t);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_Rb_tree(&local_90,&v_sections_to_remove._M_t);
    BinaryReaderStrip::BinaryReaderStrip
              ((BinaryReaderStrip *)local_150,
               (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&local_60,
               (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&local_90,&local_168);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
    RVar2 = wabt::ReadBinary(local_1a8,lStack_1a0 - (long)local_1a8,
                             (BinaryReaderDelegate *)local_150,(ReadBinaryOptions *)local_1d8);
    local_188._8_8_ = 0;
    local_178 = (code *)((ulong)local_178 & 0xffffffffffffff00);
    RVar3.enum_ = Error;
    local_188._M_unused._M_object = &local_178;
    wabt::FormatErrorsToFile
              (&local_168,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_188,Never,
               0x50);
    if ((code **)local_188._M_unused._0_8_ != &local_178) {
      operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
    }
    if (RVar2.enum_ != Error) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&s_outfile_abi_cxx11_);
      }
      filename_00._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
      filename_00._M_len = s_outfile_abi_cxx11_._M_string_length;
      RVar3 = wabt::OutputBuffer::WriteToFile
                        ((OutputBuffer *)local_120._M_allocated_capacity,filename_00);
    }
    local_150._0_8_ = &PTR__BinaryReaderStrip_00135560;
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_erase(&local_e0,(_Link_type)local_e0._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_erase((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_110,(_Link_type)local_110._16_8_);
    local_150._16_8_ = &PTR__MemoryStream_001365b0;
    if ((OutputBuffer *)local_120._M_allocated_capacity != (OutputBuffer *)0x0) {
      std::default_delete<wabt::OutputBuffer>::operator()
                ((default_delete<wabt::OutputBuffer> *)local_120._M_local_buf,
                 (OutputBuffer *)local_120._M_allocated_capacity);
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_168);
  }
  if (local_1a8 != (void *)0x0) {
    operator_delete(local_1a8,local_198 - (long)local_1a8);
  }
  return RVar3.enum_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_filename.c_str(), &file_data);
  if (Failed(result)) {
    return Result::Error;
  }

  Errors errors;
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = false;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions options(features, nullptr, kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  BinaryReaderStrip reader(v_sections_to_keep, v_sections_to_remove, &errors);
  result = ReadBinary(file_data.data(), file_data.size(), &reader, options);
  FormatErrorsToFile(errors, Location::Type::Binary);
  if (Failed(result)) {
    return Result::Error;
  }

  if (s_outfile.empty()) {
    s_outfile = s_filename;
  }
  return reader.WriteToFile(s_outfile);
}